

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine.cpp
# Opt level: O3

int polyscope::sizeInBytes(RenderDataType *r)

{
  int iVar1;
  
  iVar1 = -1;
  if ((ulong)*r < 10) {
    iVar1 = *(int *)(&DAT_00337de0 + (ulong)*r * 4);
  }
  return iVar1;
}

Assistant:

int sizeInBytes(const RenderDataType& r) {
  switch (r) {
  case RenderDataType::Vector2Float:
    return 2 * 4;
  case RenderDataType::Vector3Float:
    return 3 * 4;
  case RenderDataType::Vector4Float:
    return 4 * 4;
  case RenderDataType::Matrix44Float:
    return 4 * 4 * 4;
  case RenderDataType::Float:
    return 4;
  case RenderDataType::Int:
    return 4;
  case RenderDataType::UInt:
    return 4;
  case RenderDataType::Vector2UInt:
    return 2 * 4;
  case RenderDataType::Vector3UInt:
    return 3 * 4;
  case RenderDataType::Vector4UInt:
    return 4 * 4;
  }
  return -1;
}